

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t3std.h
# Opt level: O2

char * lib_strnchr(char *src,size_t len,int ch)

{
  bool bVar1;
  
  for (; (bVar1 = len != 0, len = len - 1, bVar1 && (*src != '\0')); src = src + 1) {
    if (*src == ch) {
      return src;
    }
  }
  return (char *)0x0;
}

Assistant:

inline char *lib_strnchr(const char *src, size_t len, int ch)
{
    /* search until we exhaust the length limit or reach a null byte */
    for ( ; len != 0 && *src != '\0' ; --len, ++src)
    {
        /* if this is the character we're looking for, return the pointer */
        if (*src == ch)
            return (char *)src;
    }

    /* didn't find it */
    return 0;
}